

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void ImPlot::PlotErrorBarsH<float>
               (char *label_id,float *xs,float *ys,float *neg,float *pos,int count,int offset,
               int stride)

{
  GetterError<float> local_30;
  
  if (count == 0) {
    local_30.Offset = 0;
  }
  else {
    local_30.Offset = (offset % count + count) % count;
  }
  local_30.Stride = stride;
  local_30.Xs = xs;
  local_30.Ys = ys;
  local_30.Neg = neg;
  local_30.Pos = pos;
  local_30.Count = count;
  PlotErrorBarsHEx<ImPlot::GetterError<float>>(label_id,&local_30);
  return;
}

Assistant:

void PlotErrorBarsH(const char* label_id, const T* xs, const T* ys, const T* neg, const T* pos, int count, int offset, int stride) {
    GetterError<T> getter(xs, ys, neg, pos, count, offset, stride);
    PlotErrorBarsHEx(label_id, getter);
}